

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O3

REF_STATUS
ref_clump_between_export_to(REF_GRID_conflict ref_grid,REF_INT node0,REF_INT node1,char *filename)

{
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_NODE ref_node;
  REF_NODE pRVar4;
  REF_DBL *pRVar5;
  REF_DBL *pRVar6;
  REF_CELL pRVar7;
  uint uVar8;
  undefined8 uVar9;
  REF_CELL pRVar10;
  uint *puVar11;
  uint uVar12;
  REF_INT RVar13;
  REF_GLOB n_global;
  char *pcVar14;
  int iVar15;
  uint key;
  long lVar16;
  long lVar17;
  REF_INT new_cell;
  REF_DICT node_dict;
  REF_GRID_conflict loc_grid;
  REF_INT new_node;
  REF_INT nodes [27];
  int local_dc;
  REF_DICT local_d8;
  uint local_d0;
  uint local_cc;
  REF_CELL local_c8;
  long local_c0;
  REF_GRID local_b8;
  int local_ac;
  uint local_a8 [28];
  char *local_38;
  
  uVar8 = ref_grid_create(&local_b8,ref_grid->mpi);
  if (uVar8 == 0) {
    uVar8 = ref_dict_create(&local_d8);
    if (uVar8 == 0) {
      pRVar1 = ref_grid->cell[3];
      local_cc = node0;
      local_38 = filename;
      if (((node0 < 0) || (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= node0)) ||
         (lVar16 = (long)pRVar2->first[(uint)node0], lVar16 == -1)) {
LAB_001f6add:
        if (((node1 < 0) || (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= node1)) ||
           (lVar16 = (long)pRVar2->first[(uint)node1], lVar16 == -1)) {
LAB_001f6b7b:
          pRVar1 = ref_grid->cell[8];
          if ((((int)local_cc < 0) || (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= (int)local_cc)) ||
             (lVar16 = (long)pRVar2->first[local_cc], lVar16 == -1)) {
LAB_001f6c1f:
            if (((node1 < 0) || (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= node1)) ||
               (lVar16 = (long)pRVar2->first[(uint)node1], lVar16 == -1)) {
LAB_001f6cbd:
              ref_node = local_b8->node;
              n_global = (REF_GLOB)local_d8->n;
              local_d0 = node1;
              if (n_global < 1) {
LAB_001f6d84:
                uVar8 = ref_node_initialize_n_global(ref_node,n_global);
                if (uVar8 == 0) {
                  uVar12 = 0;
                  pRVar1 = ref_grid->cell[8];
                  pRVar10 = local_b8->cell[8];
                  if ((((int)local_cc < 0) ||
                      (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= (int)local_cc)) ||
                     (lVar16 = (long)pRVar2->first[local_cc], lVar16 == -1)) {
LAB_001f70a8:
                    if ((((int)local_d0 < 0) ||
                        (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= (int)local_d0)) ||
                       (lVar16 = (long)pRVar2->first[local_d0], lVar16 == -1)) {
LAB_001f7238:
                      pRVar1 = ref_grid->cell[3];
                      pRVar10 = local_b8->cell[3];
                      key = local_d0;
                      if ((((int)local_cc < 0) ||
                          (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= (int)local_cc)) ||
                         (lVar16 = (long)pRVar2->first[local_cc], lVar16 == -1)) {
LAB_001f73d7:
                        if ((((int)key < 0) || (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= (int)key)
                            ) || (lVar16 = (long)pRVar2->first[key], lVar16 == -1)) {
LAB_001f7539:
                          uVar8 = ref_dict_location(local_d8,local_cc,(REF_INT *)local_a8);
                          if (uVar8 == 0) {
                            uVar8 = ref_dict_location(local_d8,key,(REF_INT *)(local_a8 + 1));
                            if (uVar8 == 0) {
                              printf("node0 %d node1 %d\n",(ulong)local_a8[0],(ulong)local_a8[1]);
                              uVar8 = ref_dict_free(local_d8);
                              if (uVar8 == 0) {
                                uVar8 = ref_export_by_extension(local_b8,local_38);
                                if (uVar8 == 0) {
                                  uVar8 = ref_grid_free(local_b8);
                                  if (uVar8 == 0) {
                                    return 0;
                                  }
                                  pcVar14 = "free loc grid";
                                  uVar9 = 0x16f;
                                }
                                else {
                                  pcVar14 = "dump";
                                  uVar9 = 0x16d;
                                }
                              }
                              else {
                                pcVar14 = "free nodes";
                                uVar9 = 0x16b;
                              }
                            }
                            else {
                              pcVar14 = "map1";
                              uVar9 = 0x168;
                            }
                          }
                          else {
                            pcVar14 = "map0";
                            uVar9 = 0x167;
                          }
                        }
                        else {
                          uVar8 = ref_cell_nodes(pRVar1,pRVar2->item[lVar16].ref,(REF_INT *)local_a8
                                                );
                          pRVar7 = local_c8;
                          while (local_c8 = pRVar10, uVar8 == 0) {
                            if (0 < pRVar1->node_per) {
                              puVar11 = local_a8;
                              lVar17 = 0;
                              do {
                                uVar8 = ref_dict_location(local_d8,*puVar11,(REF_INT *)puVar11);
                                if (uVar8 != 0) {
                                  uVar9 = 0x15f;
LAB_001f7626:
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                                         ,uVar9,"ref_clump_between_export_to",(ulong)uVar8,"map");
                                  return uVar8;
                                }
                                lVar17 = lVar17 + 1;
                                puVar11 = puVar11 + 1;
                              } while (lVar17 < pRVar1->node_per);
                            }
                            pRVar10 = local_c8;
                            uVar8 = ref_cell_with(local_c8,(REF_INT *)local_a8,&local_dc);
                            if ((uVar8 != 0) && (uVar8 != 5)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                                     ,0x161,"ref_clump_between_export_to",(ulong)uVar8,"exists?");
                              uVar12 = uVar8;
                            }
                            key = local_d0;
                            if ((uVar8 != 5) && (uVar8 != 0)) {
                              return uVar12;
                            }
                            if ((local_dc == -1) &&
                               (uVar8 = ref_cell_add(pRVar10,(REF_INT *)local_a8,&local_dc),
                               uVar8 != 0)) {
                              uVar9 = 0x163;
LAB_001f7745:
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                                     ,uVar9,"ref_clump_between_export_to",(ulong)uVar8,"new cell");
                              return uVar8;
                            }
                            pRVar3 = pRVar1->ref_adj->item;
                            lVar16 = (long)pRVar3[(int)lVar16].next;
                            if (lVar16 == -1) goto LAB_001f7539;
                            uVar8 = ref_cell_nodes(pRVar1,pRVar3[lVar16].ref,(REF_INT *)local_a8);
                            pRVar10 = local_c8;
                            pRVar7 = local_c8;
                          }
                          pcVar14 = "n";
                          uVar9 = 0x15c;
                          local_c8 = pRVar7;
                        }
                      }
                      else {
                        uVar8 = ref_cell_nodes(pRVar1,pRVar2->item[lVar16].ref,(REF_INT *)local_a8);
                        pRVar7 = local_c8;
                        while (local_c8 = pRVar10, uVar8 == 0) {
                          if (0 < pRVar1->node_per) {
                            puVar11 = local_a8;
                            lVar17 = 0;
                            do {
                              uVar8 = ref_dict_location(local_d8,*puVar11,(REF_INT *)puVar11);
                              if (uVar8 != 0) {
                                uVar9 = 0x154;
                                goto LAB_001f7626;
                              }
                              lVar17 = lVar17 + 1;
                              puVar11 = puVar11 + 1;
                            } while (lVar17 < pRVar1->node_per);
                          }
                          pRVar10 = local_c8;
                          uVar8 = ref_cell_with(local_c8,(REF_INT *)local_a8,&local_dc);
                          if ((uVar8 != 0) && (uVar8 != 5)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                                   ,0x156,"ref_clump_between_export_to",(ulong)uVar8,"exists?");
                            uVar12 = uVar8;
                          }
                          key = local_d0;
                          if ((uVar8 != 5) && (uVar8 != 0)) {
                            return uVar12;
                          }
                          if ((local_dc == -1) &&
                             (uVar8 = ref_cell_add(pRVar10,(REF_INT *)local_a8,&local_dc),
                             uVar8 != 0)) {
                            uVar9 = 0x158;
                            goto LAB_001f7745;
                          }
                          pRVar3 = pRVar1->ref_adj->item;
                          lVar16 = (long)pRVar3[(int)lVar16].next;
                          pRVar10 = local_c8;
                          if (lVar16 == -1) goto LAB_001f73d7;
                          uVar8 = ref_cell_nodes(pRVar1,pRVar3[lVar16].ref,(REF_INT *)local_a8);
                          pRVar10 = local_c8;
                          pRVar7 = local_c8;
                        }
                        pcVar14 = "n";
                        uVar9 = 0x151;
                        local_c8 = pRVar7;
                      }
                    }
                    else {
                      uVar8 = ref_cell_nodes(pRVar1,pRVar2->item[lVar16].ref,(REF_INT *)local_a8);
                      pRVar7 = local_c8;
                      while (local_c8 = pRVar10, uVar8 == 0) {
                        local_c0 = lVar16;
                        if (0 < pRVar1->node_per) {
                          puVar11 = local_a8;
                          lVar16 = 0;
                          do {
                            uVar8 = ref_dict_location(local_d8,*puVar11,(REF_INT *)puVar11);
                            if (uVar8 != 0) {
                              uVar9 = 0x146;
                              goto LAB_001f7626;
                            }
                            lVar16 = lVar16 + 1;
                            puVar11 = puVar11 + 1;
                          } while (lVar16 < pRVar1->node_per);
                        }
                        pRVar10 = local_c8;
                        uVar8 = ref_cell_with(local_c8,(REF_INT *)local_a8,&local_dc);
                        if ((uVar8 != 0) && (uVar8 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                                 ,0x148,"ref_clump_between_export_to",(ulong)uVar8,"exists?");
                          uVar12 = uVar8;
                        }
                        if ((uVar8 != 5) && (uVar8 != 0)) {
                          return uVar12;
                        }
                        if ((local_dc == -1) &&
                           (uVar8 = ref_cell_add(pRVar10,(REF_INT *)local_a8,&local_dc), uVar8 != 0)
                           ) {
                          uVar9 = 0x14a;
                          goto LAB_001f7745;
                        }
                        pRVar3 = pRVar1->ref_adj->item;
                        lVar16 = (long)pRVar3[(int)local_c0].next;
                        if (lVar16 == -1) goto LAB_001f7238;
                        local_c0 = lVar16;
                        uVar8 = ref_cell_nodes(pRVar1,pRVar3[lVar16].ref,(REF_INT *)local_a8);
                        lVar16 = local_c0;
                        pRVar10 = local_c8;
                        pRVar7 = local_c8;
                      }
                      pcVar14 = "n";
                      uVar9 = 0x143;
                      local_c8 = pRVar7;
                    }
                  }
                  else {
                    uVar8 = ref_cell_nodes(pRVar1,pRVar2->item[lVar16].ref,(REF_INT *)local_a8);
                    if (uVar8 == 0) {
                      uVar12 = 0;
                      local_c8 = pRVar10;
                      local_c0 = lVar16;
                      do {
                        if (0 < pRVar1->node_per) {
                          puVar11 = local_a8;
                          lVar16 = 0;
                          do {
                            uVar8 = ref_dict_location(local_d8,*puVar11,(REF_INT *)puVar11);
                            if (uVar8 != 0) {
                              uVar9 = 0x13b;
                              goto LAB_001f7626;
                            }
                            lVar16 = lVar16 + 1;
                            puVar11 = puVar11 + 1;
                          } while (lVar16 < pRVar1->node_per);
                        }
                        pRVar10 = local_c8;
                        uVar8 = ref_cell_with(local_c8,(REF_INT *)local_a8,&local_dc);
                        if ((uVar8 != 0) && (uVar8 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                                 ,0x13d,"ref_clump_between_export_to",(ulong)uVar8,"exists?");
                          uVar12 = uVar8;
                        }
                        if ((uVar8 != 5) && (uVar8 != 0)) {
                          return uVar12;
                        }
                        if ((local_dc == -1) &&
                           (uVar8 = ref_cell_add(pRVar10,(REF_INT *)local_a8,&local_dc), uVar8 != 0)
                           ) {
                          uVar9 = 0x13f;
                          goto LAB_001f7745;
                        }
                        pRVar3 = pRVar1->ref_adj->item;
                        lVar16 = (long)pRVar3[(int)local_c0].next;
                        if (lVar16 == -1) goto LAB_001f70a8;
                        local_c0 = lVar16;
                        uVar8 = ref_cell_nodes(pRVar1,pRVar3[lVar16].ref,(REF_INT *)local_a8);
                      } while (uVar8 == 0);
                    }
                    pcVar14 = "n";
                    uVar9 = 0x138;
                  }
                }
                else {
                  pcVar14 = "init glob";
                  uVar9 = 0x133;
                }
              }
              else {
                pRVar4 = ref_grid->node;
                iVar15 = *local_d8->key;
                uVar8 = ref_node_add(ref_node,0,&local_ac);
                if (uVar8 == 0) {
                  lVar16 = 0;
                  do {
                    pRVar5 = pRVar4->real;
                    pRVar6 = ref_node->real;
                    lVar17 = 0;
                    do {
                      pRVar6[(long)local_ac * 0xf + lVar17] = pRVar5[iVar15 * 0xf + lVar17];
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != 3);
                    lVar16 = lVar16 + 1;
                    n_global = (REF_GLOB)local_d8->n;
                    if (n_global <= lVar16) goto LAB_001f6d84;
                    iVar15 = local_d8->key[lVar16];
                    uVar8 = ref_node_add(ref_node,lVar16,&local_ac);
                  } while (uVar8 == 0);
                }
                pcVar14 = "new_node";
                uVar9 = 300;
              }
            }
            else {
              RVar13 = pRVar2->item[lVar16].ref;
              while (uVar8 = ref_cell_nodes(pRVar1,RVar13,(REF_INT *)local_a8), uVar8 == 0) {
                if (0 < pRVar1->node_per) {
                  lVar17 = 0;
                  do {
                    uVar8 = ref_dict_store(local_d8,local_a8[lVar17],0);
                    if (uVar8 != 0) {
                      pcVar14 = "store";
                      uVar9 = 0x126;
                      goto LAB_001f6a0f;
                    }
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < pRVar1->node_per);
                }
                pRVar3 = pRVar1->ref_adj->item;
                lVar16 = (long)pRVar3[(int)lVar16].next;
                if (lVar16 == -1) goto LAB_001f6cbd;
                RVar13 = pRVar3[lVar16].ref;
              }
              pcVar14 = "n";
              uVar9 = 0x124;
            }
          }
          else {
            RVar13 = pRVar2->item[lVar16].ref;
            while (uVar8 = ref_cell_nodes(pRVar1,RVar13,(REF_INT *)local_a8), uVar8 == 0) {
              if (0 < pRVar1->node_per) {
                lVar17 = 0;
                do {
                  uVar8 = ref_dict_store(local_d8,local_a8[lVar17],0);
                  if (uVar8 != 0) {
                    pcVar14 = "store";
                    uVar9 = 0x121;
                    goto LAB_001f6a0f;
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar17 < pRVar1->node_per);
              }
              pRVar3 = pRVar1->ref_adj->item;
              lVar16 = (long)pRVar3[(int)lVar16].next;
              if (lVar16 == -1) goto LAB_001f6c1f;
              RVar13 = pRVar3[lVar16].ref;
            }
            pcVar14 = "n";
            uVar9 = 0x11f;
          }
        }
        else {
          RVar13 = pRVar2->item[lVar16].ref;
          while (uVar8 = ref_cell_nodes(pRVar1,RVar13,(REF_INT *)local_a8), uVar8 == 0) {
            if (0 < pRVar1->node_per) {
              lVar17 = 0;
              do {
                uVar8 = ref_dict_store(local_d8,local_a8[lVar17],0);
                if (uVar8 != 0) {
                  pcVar14 = "store";
                  uVar9 = 0x11a;
                  goto LAB_001f6a0f;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < pRVar1->node_per);
            }
            pRVar3 = pRVar1->ref_adj->item;
            lVar16 = (long)pRVar3[(int)lVar16].next;
            if (lVar16 == -1) goto LAB_001f6b7b;
            RVar13 = pRVar3[lVar16].ref;
          }
          pcVar14 = "n";
          uVar9 = 0x118;
        }
      }
      else {
        RVar13 = pRVar2->item[lVar16].ref;
        while (uVar8 = ref_cell_nodes(pRVar1,RVar13,(REF_INT *)local_a8), uVar8 == 0) {
          if (0 < pRVar1->node_per) {
            lVar17 = 0;
            do {
              uVar8 = ref_dict_store(local_d8,local_a8[lVar17],0);
              if (uVar8 != 0) {
                pcVar14 = "store";
                uVar9 = 0x115;
                goto LAB_001f6a0f;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < pRVar1->node_per);
          }
          pRVar3 = pRVar1->ref_adj->item;
          lVar16 = (long)pRVar3[(int)lVar16].next;
          if (lVar16 == -1) goto LAB_001f6add;
          RVar13 = pRVar3[lVar16].ref;
        }
        pcVar14 = "n";
        uVar9 = 0x113;
      }
    }
    else {
      pcVar14 = "create nodes";
      uVar9 = 0x10f;
    }
  }
  else {
    pcVar14 = "create grid";
    uVar9 = 0x10d;
  }
LAB_001f6a0f:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar9,
         "ref_clump_between_export_to",(ulong)uVar8,pcVar14);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_clump_between_export_to(REF_GRID ref_grid, REF_INT node0,
                                               REF_INT node1,
                                               const char *filename) {
  REF_GRID loc_grid;
  REF_NODE ref_node, loc_node;
  REF_CELL ref_cell, loc_cell;
  REF_INT item, cell, cell_node;
  REF_INT old, index, new_cell, new_node, ixyz;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DICT node_dict;

  RSS(ref_grid_create(&loc_grid, ref_grid_mpi(ref_grid)), "create grid");

  RSS(ref_dict_create(&node_dict), "create nodes");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  ref_node = ref_grid_node(ref_grid);
  loc_node = ref_grid_node(loc_grid);
  each_ref_dict_key(node_dict, index, old) {
    RSS(ref_node_add(loc_node, index, &new_node), "new_node");
    for (ixyz = 0; ixyz < 3; ixyz++) {
      ref_node_xyz(loc_node, ixyz, new_node) =
          ref_node_xyz(ref_node, ixyz, old);
    }
  }
  RSS(ref_node_initialize_n_global(loc_node, ref_dict_n(node_dict)),
      "init glob");

  ref_cell = ref_grid_tet(ref_grid);
  loc_cell = ref_grid_tet(loc_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  loc_cell = ref_grid_tri(loc_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }

  RSS(ref_dict_location(node_dict, node0, &(nodes[0])), "map0");
  RSS(ref_dict_location(node_dict, node1, &(nodes[1])), "map1");
  printf("node0 %d node1 %d\n", nodes[0], nodes[1]);

  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_export_by_extension(loc_grid, filename), "dump");

  RSS(ref_grid_free(loc_grid), "free loc grid");

  return REF_SUCCESS;
}